

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O2

void libxml_domnode_binary_insertion_sort_start(xmlNodePtr *dst,size_t start,size_t size)

{
  xmlNodePtr x;
  xmlNodePtr y;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  do {
    if (size <= start) {
      return;
    }
    x = dst[start - 1];
    y = dst[start];
    iVar1 = wrap_cmp(x,y);
    if (0 < iVar1) {
      uVar4 = start - 1;
      iVar1 = wrap_cmp(y,*dst);
      if (iVar1 < 0) {
        uVar5 = 0;
      }
      else {
        iVar1 = wrap_cmp(y,x);
        uVar5 = uVar4;
        if (iVar1 < 1) {
          uVar5 = uVar4 >> 1;
          uVar3 = 0;
          uVar6 = uVar4;
          do {
            iVar1 = wrap_cmp(y,dst[uVar5]);
            if (iVar1 < 0) {
              uVar2 = uVar5 - uVar3;
              uVar6 = uVar5;
              if (uVar2 < 2) break;
            }
            else {
              uVar2 = uVar6 - uVar5;
              uVar3 = uVar5;
              if (uVar2 < 2) {
                uVar5 = uVar5 + 1;
                break;
              }
            }
            uVar5 = (uVar2 >> 1) + uVar3;
          } while( true );
        }
      }
      do {
        if (uVar4 < uVar5) break;
        dst[uVar4 + 1] = dst[uVar4];
        bVar7 = uVar4 != 0;
        uVar4 = uVar4 - 1;
      } while (bVar7);
      dst[uVar5] = y;
    }
    start = start + 1;
  } while( true );
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start, const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}